

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O0

int GetHeadDataAndAuxDataSeanetEx
              (SEANET *pSeanet,uchar *scanline,double *pAngle,uchar *strippedauxdatabuf,
              int *pNbstrippedauxdatabytes)

{
  int *pNbstrippedauxdatabytes_local;
  uchar *strippedauxdatabuf_local;
  double *pAngle_local;
  uchar *scanline_local;
  SEANET *pSeanet_local;
  
  if (bSeanetFromFile == 0) {
    pSeanet_local._4_4_ =
         GetHeadDataAndAuxDataSeanet
                   (pSeanet,scanline,pAngle,strippedauxdatabuf,pNbstrippedauxdatabytes);
  }
  else {
    pSeanet_local._4_4_ = GetHeadDataSeanetEx(pSeanet,scanline,pAngle);
  }
  return pSeanet_local._4_4_;
}

Assistant:

int GetHeadDataAndAuxDataSeanetEx(SEANET* pSeanet,
	unsigned char* scanline, double* pAngle,
	unsigned char* strippedauxdatabuf, int* pNbstrippedauxdatabytes)
{
	if (!bSeanetFromFile) return GetHeadDataAndAuxDataSeanet(pSeanet, scanline, pAngle, strippedauxdatabuf, pNbstrippedauxdatabytes);
	else return GetHeadDataSeanetEx(pSeanet, scanline, pAngle);
}